

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# satSolver3.c
# Opt level: O0

int sat_clause_compute_lbd(sat_solver3 *s,clause *c)

{
  int iVar1;
  int local_28;
  uint local_24;
  int lbd;
  int minl;
  int lev;
  int i;
  clause *c_local;
  sat_solver3 *s_local;
  
  local_24 = 0;
  local_28 = 0;
  for (minl = 0; minl < (int)((uint)*c >> 0xb); minl = minl + 1) {
    iVar1 = lit_var((lit)c[(long)minl + 1]);
    iVar1 = var_level(s,iVar1);
    if ((local_24 & 1 << ((byte)iVar1 & 0x1f)) == 0) {
      local_24 = 1 << ((byte)iVar1 & 0x1f) | local_24;
      local_28 = local_28 + 1;
    }
  }
  return local_28;
}

Assistant:

static inline int sat_clause_compute_lbd( sat_solver3* s, clause* c )
{
    int i, lev, minl = 0, lbd = 0;
    for (i = 0; i < (int)c->size; i++)
    {
        lev = var_level(s, lit_var(c->lits[i]));
        if ( !(minl & (1 << (lev & 31))) )
        {
            minl |= 1 << (lev & 31);
            lbd++;
//            printf( "%d ", lev );
        }
    }
//    printf( " -> %d\n", lbd );
    return lbd;
}